

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

IStreamingReporterPtr __thiscall
Catch::ReporterFactory<Catch::CompactReporter>::create
          (ReporterFactory<Catch::CompactReporter> *this,ReporterConfig *config)

{
  _func_int **pp_Var1;
  undefined8 *in_RDX;
  
  pp_Var1 = (_func_int **)operator_new(0xb0);
  *(undefined2 *)(pp_Var1 + 1) = 0;
  *pp_Var1 = (_func_int *)&PTR__TeamCityReporter_001bab30;
  pp_Var1[2] = (_func_int *)in_RDX[1];
  pp_Var1[3] = (_func_int *)*in_RDX;
  pp_Var1[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 9) = 0;
  pp_Var1[10] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 0x11) = 0;
  pp_Var1[0x14] = (_func_int *)0x0;
  pp_Var1[0x15] = (_func_int *)0x0;
  pp_Var1[0x12] = (_func_int *)0x0;
  pp_Var1[0x13] = (_func_int *)0x0;
  *pp_Var1 = (_func_int *)&PTR__CompactReporter_001bc008;
  (this->super_IReporterFactory)._vptr_IReporterFactory = pp_Var1;
  return (IStreamingReporterPtr)(IStreamingReporter *)this;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
            return Detail::make_unique<T>( config );
        }